

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_str_append_text_utf8(nk_str *str,char *text,int len)

{
  int iVar1;
  int iVar2;
  int iVar3;
  nk_rune unicode;
  nk_rune local_34;
  
  iVar3 = 0;
  if (len != 0 && (text != (char *)0x0 && str != (nk_str *)0x0)) {
    iVar3 = 0;
    if (0 < len) {
      iVar2 = len;
      do {
        iVar1 = nk_utf_decode(text + iVar3,&local_34,4);
        iVar3 = iVar3 + iVar1;
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    nk_str_append_text_char(str,text,iVar3);
    iVar3 = len;
  }
  return iVar3;
}

Assistant:

NK_API int
nk_str_append_text_utf8(struct nk_str *str, const char *text, int len)
{
    int i = 0;
    int byte_len = 0;
    nk_rune unicode;
    if (!str || !text || !len) return 0;
    for (i = 0; i < len; ++i)
        byte_len += nk_utf_decode(text+byte_len, &unicode, 4);
    nk_str_append_text_char(str, text, byte_len);
    return len;
}